

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

size_t spdlog::details::os::thread_id(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = __tls_get_addr(&PTR_00569cf0);
  if (*(char *)(lVar1 + 0x13c8) != '\x01') {
    lVar2 = syscall(0xba);
    *(long *)(lVar1 + 0x13c0) = lVar2;
    *(undefined1 *)(lVar1 + 0x13c8) = 1;
  }
  return *(size_t *)(lVar1 + 0x13c0);
}

Assistant:

SPDLOG_INLINE size_t thread_id() SPDLOG_NOEXCEPT {
#if defined(SPDLOG_NO_TLS)
    return _thread_id();
#else  // cache thread id in tls
    static thread_local const size_t tid = _thread_id();
    return tid;
#endif
}